

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcSocket.cpp
# Opt level: O3

bool XmlRpc::XmlRpcSocket::nbRead(int fd,string *s,bool *eof)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  uint uVar4;
  double __x;
  char readBuf [4096];
  undefined1 auStack_1038 [4104];
  
  *eof = false;
  do {
    sVar2 = ::read(fd,auStack_1038,0xfff);
    XmlRpcUtil::log(__x);
    uVar4 = (uint)sVar2;
    if ((int)uVar4 < 1) {
      if (uVar4 != 0) {
        piVar3 = __errno_location();
        iVar1 = *piVar3;
        if (iVar1 == 4) {
          return true;
        }
        if (iVar1 == 0x73) {
          return true;
        }
        if (iVar1 == 0xb) {
          return true;
        }
        return false;
      }
      *eof = true;
    }
    else {
      auStack_1038[uVar4 & 0x7fffffff] = 0;
      std::__cxx11::string::append((char *)s,(ulong)auStack_1038);
    }
    if (*eof == true) {
      return true;
    }
  } while( true );
}

Assistant:

bool XmlRpcSocket::nbRead(int fd, std::string& s, bool *eof)
{
  const int READ_SIZE = 4096;   // Number of bytes to attempt to read at a time
  char readBuf[READ_SIZE];

  bool wouldBlock = false;
  *eof = false;

  while ( ! wouldBlock && ! *eof) {
#if defined(_WIN32)
    int n = recv(fd, readBuf, READ_SIZE-1, 0);
#else
    int n = read(fd, readBuf, READ_SIZE-1);
#endif
    XmlRpcUtil::log(5, "XmlRpcSocket::nbRead: read/recv returned %d.", n);

    if (n > 0) {
      readBuf[n] = 0;
      s.append(readBuf, n);
    } else if (n == 0) {
      *eof = true;
    } else if (nonFatalError()) {
      wouldBlock = true;
    } else {
      return false;   // Error
    }
  }
  return true;
}